

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GotoLabel *goto_label)

{
  bool bVar1;
  Label *pLVar2;
  pointer pTVar3;
  pointer args;
  LabelName *u;
  LabelName *u_00;
  uint uVar4;
  int iVar5;
  pointer pTVar6;
  pointer pTVar7;
  anon_union_32_2_9f84448a_for_Var_2 *local_58 [2];
  long local_48 [2];
  string *local_38;
  
  pLVar2 = FindLabel((CWriter *)
                     (this->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (Var *)(this->label_stack_).
                            super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                            ._M_impl.super__Vector_impl_data._M_finish,SUB81(goto_label->var,0));
  args = (pLVar2->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pTVar7 = (pLVar2->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (args != pTVar7) {
    pTVar6 = (pointer)((long)(this->type_stack_).
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->type_stack_).
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3);
    pTVar3 = (pointer)pLVar2->type_stack_size;
    if (pTVar6 < pTVar3) {
      __assert_fail("type_stack_.size() >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x497,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    pTVar7 = (pointer)((long)pTVar7 - (long)args >> 3);
    args = (pointer)((long)pTVar6 - (long)pTVar7);
    if (pTVar6 < pTVar7) {
      __assert_fail("type_stack_.size() >= amount",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x498,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    if (args < pTVar3) {
      __assert_fail("type_stack_.size() - amount >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x499,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    iVar5 = (int)pTVar6 - ((int)pTVar3 + (int)pTVar7);
    if (iVar5 != 0) {
      pTVar3 = (pointer)0x0;
      pTVar6 = (pointer)0x1;
      do {
        uVar4 = ~(uint)pTVar3 + (int)pTVar7;
        args = (pLVar2->sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
        Write(this,(StackVar *)(ulong)(iVar5 + uVar4));
        WriteData(this," = ",3);
        Write(this,(StackVar *)(ulong)uVar4);
        WriteData(this,"; ",2);
        bVar1 = pTVar6 < pTVar7;
        pTVar3 = pTVar6;
        pTVar6 = (pointer)(ulong)((int)pTVar6 + 1);
      } while (bVar1);
    }
  }
  WriteUnwindTryCatchStack(this,(Label *)pLVar2->try_catch_stack_size);
  if (goto_label->var->type_ == Name) {
    local_58[0] = &goto_label->var->field_2;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])local_58,u,(char (*) [2])args);
  }
  else {
    local_58[0] = (anon_union_32_2_9f84448a_for_Var_2 *)local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,&(anonymous_namespace)::kImplicitFuncLabel,0x1ec38a);
    local_38 = (string *)local_58;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])&local_38,u_00,(char (*) [2])args);
    if (local_58[0] != (anon_union_32_2_9f84448a_for_Var_2 *)local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  return;
}

Assistant:

void CWriter::Write(const GotoLabel& goto_label) {
  const Label* label = FindLabel(goto_label.var);
  if (label->HasValue()) {
    size_t amount = label->sig.size();
    assert(type_stack_.size() >= label->type_stack_size);
    assert(type_stack_.size() >= amount);
    assert(type_stack_.size() - amount >= label->type_stack_size);
    Index offset = type_stack_.size() - label->type_stack_size - amount;
    if (offset != 0) {
      for (Index i = 0; i < amount; ++i) {
        Write(StackVar(amount - i - 1 + offset, label->sig[i]), " = ",
              StackVar(amount - i - 1), "; ");
      }
    }
  }

  WriteUnwindTryCatchStack(label);

  if (goto_label.var.is_name()) {
    Write("goto ", LabelName(goto_label.var.name()), ";");
  } else {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    Write("goto ", LabelName(kImplicitFuncLabel), ";");
  }
}